

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ssize_t __thiscall
kj::VectorOutputStream::write(VectorOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte **params_2;
  uchar *puVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  byte *__src;
  byte *__dest;
  Fault f;
  size_t size;
  DebugComparison<unsigned_long_&,_long> _kjCondition;
  uchar *local_28;
  
  __src = (byte *)CONCAT44(in_register_00000034,__fd);
  params_2 = &this->fillPos;
  __dest = this->fillPos;
  puVar1 = (this->vector).ptr;
  sVar2 = (this->vector).size_;
  size = (size_t)__buf;
  if ((__dest == __src) &&
     (_kjCondition.right = (long)(puVar1 + (sVar2 - (long)__src)),
     (uchar *)_kjCondition.right != (uchar *)0x0)) {
    _kjCondition.left = &size;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = (ulong)_kjCondition.right >= __buf;
    if ((ulong)_kjCondition.right < __buf) {
      local_28 = (uchar *)_kjCondition.right;
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,long>&,unsigned_long&,unsigned_char*&,long>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x133,FAILED,"size <= vector.end() - fillPos",
                 "_kjCondition,size, fillPos, vector.end() - fillPos",&_kjCondition,
                 _kjCondition.left,params_2,(long *)&local_28);
      _::Debug::Fault::fatal(&f);
    }
  }
  else {
    if (puVar1 + (sVar2 - (long)__dest) < __buf) {
      grow(this,(long)(__dest + (long)__buf) - (long)puVar1);
      __dest = this->fillPos;
    }
    _kjCondition.left = (unsigned_long *)memcpy(__dest,__src,(size_t)__buf);
    __dest = *params_2;
  }
  *params_2 = __dest + (long)__buf;
  return (ssize_t)_kjCondition.left;
}

Assistant:

void VectorOutputStream::write(ArrayPtr<const byte> src) {
  auto size = src.size();
  if (src.begin() == fillPos && fillPos != vector.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= vector.end() - fillPos, size, fillPos, vector.end() - fillPos);
    fillPos += size;
  } else {
    if (vector.end() - fillPos < size) {
      grow(fillPos - vector.begin() + size);
    }

    memcpy(fillPos, src.begin(), size);
    fillPos += size;
  }
}